

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

uchar ecp_pick_window_size(mbedtls_ecp_group *grp,uchar p_eq_g)

{
  int iVar1;
  byte local_12;
  uchar w;
  uchar p_eq_g_local;
  mbedtls_ecp_group *grp_local;
  
  local_12 = 4;
  if (0x17f < grp->nbits) {
    local_12 = 5;
  }
  if (p_eq_g != '\0') {
    local_12 = local_12 + 1;
    iVar1 = ecp_group_is_static_comb_table(grp);
    if (iVar1 != 0) goto LAB_00375943;
  }
  if (2 < local_12) {
    local_12 = 2;
  }
LAB_00375943:
  if (grp->nbits <= (ulong)local_12) {
    local_12 = 2;
  }
  return local_12;
}

Assistant:

static unsigned char ecp_pick_window_size(const mbedtls_ecp_group *grp,
                                          unsigned char p_eq_g)
{
    unsigned char w;

    /*
     * Minimize the number of multiplications, that is minimize
     * 10 * d * w + 18 * 2^(w-1) + 11 * d + 7 * w, with d = ceil( nbits / w )
     * (see costs of the various parts, with 1S = 1M)
     */
    w = grp->nbits >= 384 ? 5 : 4;

    /*
     * If P == G, pre-compute a bit more, since this may be re-used later.
     * Just adding one avoids upping the cost of the first mul too much,
     * and the memory cost too.
     */
    if (p_eq_g) {
        w++;
    }

    /*
     * If static comb table may not be used (!p_eq_g) or static comb table does
     * not exists, make sure w is within bounds.
     * (The last test is useful only for very small curves in the test suite.)
     *
     * The user reduces MBEDTLS_ECP_WINDOW_SIZE does not changes the size of
     * static comb table, because the size of static comb table is fixed when
     * it is generated.
     */
#if (MBEDTLS_ECP_WINDOW_SIZE < 6)
    if ((!p_eq_g || !ecp_group_is_static_comb_table(grp)) && w > MBEDTLS_ECP_WINDOW_SIZE) {
        w = MBEDTLS_ECP_WINDOW_SIZE;
    }
#endif
    if (w >= grp->nbits) {
        w = 2;
    }

    return w;
}